

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLocalGenerator *this_01;
  pointer ppcVar2;
  string *psVar3;
  cmake *pcVar4;
  pointer pcVar5;
  long lVar6;
  undefined8 this_02;
  pointer pbVar7;
  pointer pbVar8;
  bool bVar9;
  string *psVar10;
  string *__x;
  mapped_type *pmVar11;
  ostream *poVar12;
  ulong uVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *fi;
  pointer ppcVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar15;
  cmNinjaRule rule;
  string verifyScriptFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string verifyStampFile;
  cmNinjaBuild reBuild;
  undefined1 local_4c0 [32];
  _Alloc_hider local_4a0;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  _Alloc_hider local_480;
  pointer pbStack_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  pointer pbStack_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_440;
  pointer pbStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  pointer pbStack_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  _Base_ptr local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  _Alloc_hider local_3d8;
  undefined1 local_3d0 [24];
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  bool local_3a0;
  undefined1 local_348 [16];
  undefined1 local_338 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  char *local_2c0;
  size_type local_2b8;
  char local_2b0;
  uint7 uStack_2af;
  undefined8 uStack_2a8;
  char *local_2a0;
  size_type local_298;
  char local_290 [8];
  undefined8 uStack_288;
  char *local_280;
  size_type local_278;
  char local_270;
  undefined7 uStack_26f;
  undefined8 uStack_268;
  cmNinjaBuild local_260;
  string local_158;
  undefined1 local_138 [64];
  pointer local_f8;
  pointer pbStack_f0;
  pointer local_e8;
  pointer pbStack_e0;
  pointer local_d8;
  pointer pbStack_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_b0;
  pointer local_98;
  pointer pbStack_90;
  pointer local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_4c0._0_8_ = local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"CMAKE_SUPPRESS_REGENERATION","");
  bVar9 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_4c0);
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (!bVar9) {
    this_01 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_280 = &local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"RERUN_CMAKE","");
    local_4c0._0_8_ = local_4c0 + 0x10;
    if (local_280 == &local_270) {
      local_4c0._24_8_ = uStack_268;
    }
    else {
      local_4c0._0_8_ = local_280;
    }
    local_4c0._17_7_ = uStack_26f;
    local_4c0[0x10] = local_270;
    local_4a0._M_p = (pointer)&local_490;
    local_4c0._8_8_ = local_278;
    local_278 = 0;
    local_270 = '\0';
    local_498._M_p = (pointer)0x0;
    local_490._M_allocated_capacity = local_490._M_allocated_capacity & 0xffffffffffffff00;
    local_480._M_p = (pointer)&local_470;
    pbStack_478 = (pointer)0x0;
    local_470._M_allocated_capacity = local_470._M_allocated_capacity & 0xffffffffffffff00;
    local_460._M_p = (pointer)&local_450;
    pbStack_458 = (pointer)0x0;
    local_450._M_allocated_capacity = local_450._M_allocated_capacity & 0xffffffffffffff00;
    local_440._M_p = (pointer)&local_430;
    pbStack_438 = (pointer)0x0;
    local_430._M_allocated_capacity = local_430._M_allocated_capacity & 0xffffffffffffff00;
    local_420._M_p = (pointer)&local_410;
    pbStack_418 = (pointer)0x0;
    local_410._M_allocated_capacity = local_410._M_allocated_capacity & 0xffffffffffffff00;
    local_400._M_p = (pointer)&local_3f0;
    local_3f8 = (_Base_ptr)0x0;
    local_3f0._M_allocated_capacity = local_3f0._M_allocated_capacity & 0xffffffffffffff00;
    local_3e0._M_p = local_3d0;
    local_3d8._M_p = (pointer)0x0;
    local_3d0._0_8_ = local_3d0._0_8_ & 0xffffffffffffff00;
    local_3d0._16_8_ = &local_3b0;
    local_3b8 = 0;
    local_3b0._M_local_buf[0] = '\0';
    local_3a0 = false;
    local_280 = &local_270;
    CMakeCmd_abi_cxx11_((string *)local_138,this);
    std::__cxx11::string::operator=((string *)&local_4a0,(string *)local_138);
    pcVar5 = local_138 + 0x10;
    if ((pointer)local_138._0_8_ != pcVar5) {
      operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
    }
    std::__cxx11::string::append((char *)&local_4a0);
    psVar10 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this_01);
    this_00 = &this_01->super_cmOutputConverter;
    cmOutputConverter::ConvertToOutputFormat((string *)local_138,this_00,psVar10,SHELL);
    std::__cxx11::string::_M_append((char *)&local_4a0,local_138._0_8_);
    if ((pointer)local_138._0_8_ != pcVar5) {
      operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
    }
    std::__cxx11::string::append((char *)&local_4a0);
    psVar10 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_01);
    cmOutputConverter::ConvertToOutputFormat((string *)local_138,this_00,psVar10,SHELL);
    std::__cxx11::string::_M_append((char *)&local_4a0,local_138._0_8_);
    if ((pointer)local_138._0_8_ != pcVar5) {
      operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_480,0,(char *)pbStack_478,0x4f4174);
    std::__cxx11::string::_M_replace((ulong)&local_460,0,(char *)pbStack_458,0x4f4188);
    local_3a0 = true;
    WriteRule((ostream *)
              (this->RulesFileStream)._M_t.
              super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
              .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
              (cmNinjaRule *)local_4c0);
    local_338._16_8_ = this_00;
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_4c0);
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"RERUN_CMAKE","");
    local_138._32_8_ = local_138 + 0x30;
    local_138._8_8_ = 0;
    local_138[0x10] = '\0';
    if (local_2a0 == local_290) {
      local_138._56_8_ = uStack_288;
    }
    else {
      local_138._32_8_ = local_2a0;
    }
    local_80._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_80._M_impl.super__Rb_tree_header._M_header;
    local_138._40_8_ = local_298;
    local_298 = 0;
    local_290[0] = '\0';
    local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f8 = (pointer)0x0;
    pbStack_f0 = (pointer)0x0;
    local_e8 = (pointer)0x0;
    pbStack_e0 = (pointer)0x0;
    local_d8 = (pointer)0x0;
    pbStack_d0 = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    vStack_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    vStack_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98 = (pointer)0x0;
    pbStack_90 = (pointer)0x0;
    local_88 = (pointer)0x0;
    local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_2a0 = local_290;
    local_138._0_8_ = pcVar5;
    local_80._M_impl.super__Rb_tree_header._M_header._M_right =
         local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_replace((ulong)local_138,0,(char *)0x0,0x4f41a3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,NINJA_BUILD_FILE,(allocator<char> *)local_348);
    NinjaOutputPath((string *)local_4c0,this,&local_260.Comment);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0);
    if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.Comment._M_dataplus._M_p != &local_260.Comment.field_2) {
      operator_delete(local_260.Comment._M_dataplus._M_p,
                      CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                               local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ppcVar14 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar14 != ppcVar2) {
      do {
        psVar3 = ((*ppcVar14)->Makefile->ListFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar10 = ((*ppcVar14)->Makefile->ListFiles).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar3;
            psVar10 = psVar10 + 1) {
          __x = ConvertToNinjaPath(this,psVar10);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&vStack_b0,__x);
        }
        ppcVar14 = ppcVar14 + 1;
      } while (ppcVar14 != ppcVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&vStack_b0,&this->CMakeCacheFile);
    paVar1 = &local_260.Comment.field_2;
    if (this->NinjaSupportsConsolePool == true) {
      local_4c0._0_8_ = local_4c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"pool","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,(key_type *)local_4c0);
      std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x4f37b6);
      if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
    }
    pcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    if ((this->NinjaSupportsManifestRestat == true) &&
       (bVar9 = cmake::DoWriteGlobVerifyTarget(pcVar4), bVar9)) {
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"VERIFY_GLOBS","");
      local_4c0._0_8_ = local_4c0 + 0x10;
      if (local_2c0 == &local_2b0) {
        local_4c0._24_8_ = uStack_2a8;
      }
      else {
        local_4c0._0_8_ = local_2c0;
      }
      local_4c0._16_8_ = (ulong)uStack_2af << 8;
      local_4c0._8_8_ = local_2b8;
      local_2b8 = 0;
      local_2b0 = '\0';
      local_4a0._M_p = (pointer)&local_490;
      local_498._M_p = (pointer)0x0;
      local_490._M_allocated_capacity = local_490._M_allocated_capacity & 0xffffffffffffff00;
      local_480._M_p = (pointer)&local_470;
      pbStack_478 = (pointer)0x0;
      local_470._M_allocated_capacity = local_470._M_allocated_capacity & 0xffffffffffffff00;
      local_460._M_p = (pointer)&local_450;
      pbStack_458 = (pointer)0x0;
      local_450._M_allocated_capacity = local_450._M_allocated_capacity & 0xffffffffffffff00;
      local_440._M_p = (pointer)&local_430;
      pbStack_438 = (pointer)0x0;
      local_430._M_allocated_capacity = local_430._M_allocated_capacity & 0xffffffffffffff00;
      local_420._M_p = (pointer)&local_410;
      pbStack_418 = (pointer)0x0;
      local_410._M_allocated_capacity = local_410._M_allocated_capacity & 0xffffffffffffff00;
      local_400._M_p = (pointer)&local_3f0;
      local_3f8 = (_Base_ptr)0x0;
      local_3f0._M_allocated_capacity = local_3f0._M_allocated_capacity & 0xffffffffffffff00;
      local_3e0._M_p = local_3d0;
      local_3d8._M_p = (pointer)0x0;
      local_3d0._0_8_ = local_3d0._0_8_ & 0xffffffffffffff00;
      local_3d0._16_8_ = &local_3b0;
      local_3b8 = 0;
      local_3b0._M_local_buf[0] = '\0';
      local_3a0 = false;
      local_2c0 = &local_2b0;
      CMakeCmd_abi_cxx11_(&local_260.Comment,this);
      std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::append((char *)&local_4a0);
      this_02 = local_338._16_8_;
      psVar10 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
      cmOutputConverter::ConvertToOutputFormat
                (&local_260.Comment,(cmOutputConverter *)this_02,psVar10,SHELL);
      std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_260.Comment._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_480,0,(char *)pbStack_478,0x4f41db);
      std::__cxx11::string::_M_replace((ulong)&local_460,0,(char *)pbStack_458,0x4f41fe);
      local_3a0 = true;
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)local_4c0);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_4c0);
      local_2e0 = &local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"phony","");
      local_4c0._0_8_ = local_4c0 + 0x10;
      local_4c0._8_8_ = 0;
      local_4c0._16_8_ = local_4c0._16_8_ & 0xffffffffffffff00;
      local_4a0._M_p = (pointer)&local_490;
      if (local_2e0 == &local_2d0) {
        local_490._8_8_ = local_2d0._8_8_;
      }
      else {
        local_4a0._M_p = (pointer)local_2e0;
      }
      local_490._M_allocated_capacity._1_7_ = local_2d0._M_allocated_capacity._1_7_;
      local_490._M_local_buf[0] = local_2d0._M_local_buf[0];
      local_3f0._M_allocated_capacity = (size_type)&local_400;
      local_498._M_p = (pointer)local_2d8;
      local_2d8 = 0;
      local_2d0._M_local_buf[0] = '\0';
      local_400._M_p = local_400._M_p & 0xffffffff00000000;
      local_3f8 = (_Base_ptr)0x0;
      local_480._M_p = (pointer)0x0;
      pbStack_478 = (pointer)0x0;
      local_470._M_allocated_capacity = 0;
      local_470._8_8_ = 0;
      local_460._M_p = (pointer)0x0;
      pbStack_458 = (pointer)0x0;
      local_450._M_allocated_capacity = 0;
      local_450._8_8_ = 0;
      local_440._M_p = (pointer)0x0;
      pbStack_438 = (pointer)0x0;
      local_430._M_allocated_capacity = 0;
      local_430._8_8_ = 0;
      local_420._M_p = (pointer)0x0;
      pbStack_418 = (pointer)0x0;
      local_410._M_allocated_capacity = 0;
      local_3e0._M_p = (pointer)0x0;
      local_3d8._M_p = local_3d0 + 8;
      local_3d0._0_8_ = 0;
      local_3d0[8] = '\0';
      local_3f0._8_8_ = local_3f0._M_allocated_capacity;
      local_2e0 = &local_2d0;
      std::__cxx11::string::_M_replace((ulong)local_4c0,0,(char *)0x0,0x4f4228);
      psVar10 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
      pcVar5 = (psVar10->_M_dataplus)._M_p;
      local_260.Comment._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,pcVar5,pcVar5 + psVar10->_M_string_length);
      std::__cxx11::string::append((char *)&local_260);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_480,
                 &local_260.Comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      WriteBuild(this,os,(cmNinjaBuild *)local_4c0,0,(bool *)0x0);
      local_260.Comment._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"restat","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&local_260.Comment);
      std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x528368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      psVar10 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
      NinjaOutputPath((string *)local_348,this,psVar10);
      psVar10 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar4);
      NinjaOutputPath(&local_158,this,psVar10);
      local_300._0_8_ = &local_2f0;
      std::__cxx11::string::_M_construct<char_const*>(local_300,"VERIFY_GLOBS","");
      local_260.Rule._M_dataplus._M_p = (pointer)&local_260.Rule.field_2;
      local_260.Comment._M_string_length = 0;
      local_260.Comment.field_2._M_allocated_capacity._0_4_ =
           local_260.Comment.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._0_8_ == &local_2f0) {
        local_260.Rule.field_2._8_8_ = local_2f0._8_8_;
      }
      else {
        local_260.Rule._M_dataplus._M_p = (pointer)local_300._0_8_;
      }
      local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_header;
      local_260.Rule._M_string_length._0_1_ = local_300[8];
      local_260.Rule._M_string_length._1_1_ = local_300[9];
      local_260.Rule._M_string_length._2_1_ = local_300[10];
      local_260.Rule._M_string_length._3_1_ = local_300[0xb];
      local_260.Rule._M_string_length._4_1_ = local_300[0xc];
      local_260.Rule._M_string_length._5_1_ = local_300[0xd];
      local_260.Rule._M_string_length._6_1_ = local_300[0xe];
      local_260.Rule._M_string_length._7_1_ = local_300[0xf];
      local_300[8] = (string)0x0;
      local_300[9] = (string)0x0;
      local_300[10] = (string)0x0;
      local_300[0xb] = (string)0x0;
      local_300[0xc] = (string)0x0;
      local_300[0xd] = (string)0x0;
      local_300[0xe] = (string)0x0;
      local_300[0xf] = (string)0x0;
      local_2f0._M_local_buf[0] = '\0';
      local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_260.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_260.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_260.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_260.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_260.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_260.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_260.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_260.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_260.ExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_260.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_260.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_260.ImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_260.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_260.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_260.OrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_260.RspFile._M_dataplus._M_p = (pointer)&local_260.RspFile.field_2;
      local_260.RspFile._M_string_length = 0;
      local_260.RspFile.field_2._M_local_buf[0] = '\0';
      local_300._0_8_ = &local_2f0;
      local_260.Comment._M_dataplus._M_p = (pointer)paVar1;
      local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_260.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_replace((ulong)&local_260,0,(char *)0x0,0x4f4255);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_260.Outputs,&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_260.ImplicitDeps,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_480);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&local_260.Variables._M_t,&local_80);
      WriteBuild(this,os,&local_260,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild(&local_260);
      local_260.Comment._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"restat","");
      pVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&local_80,&local_260.Comment);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&local_80,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&vStack_b0,(value_type *)local_348);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_c8,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_348._0_8_ != (element_type *)local_338) {
        operator_delete((void *)local_348._0_8_,
                        (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                   *)local_338._0_8_)->_M_t)._M_impl.field_0x1);
      }
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_4c0);
    }
    else if ((this->NinjaSupportsManifestRestat == false) &&
            (bVar9 = cmake::DoWriteGlobVerifyTarget(pcVar4), bVar9)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,"The detected version of Ninja:\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"  ",2);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,(this->NinjaVersion)._M_dataplus._M_p,
                           (this->NinjaVersion)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "is less than the version of Ninja required by CMake for adding restat dependencies to the build.ninja manifest regeneration target:\n"
                 ,0x84);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  ",2);
      local_260.Comment.field_2._M_allocated_capacity._0_4_ = 0x382e31;
      local_260.Comment._M_string_length = 3;
      local_260.Comment._M_dataplus._M_p = (pointer)paVar1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,paVar1->_M_local_buf,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,
                 "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by Ninja."
                 ,0x6a);
      pcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_348._0_8_ = (element_type *)0x0;
      local_348._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&local_260.Comment,(cmListFileBacktrace *)local_348)
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.Comment._M_dataplus._M_p,
                        CONCAT44(local_260.Comment.field_2._M_allocated_capacity._4_4_,
                                 local_260.Comment.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::ios_base::~ios_base((ios_base *)local_450._M_local_buf);
    }
    pbVar8 = vStack_b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar7 = vStack_b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (vStack_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vStack_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar13 = (long)vStack_b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vStack_b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar6 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (vStack_b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 vStack_b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar7,pbVar8);
    }
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (vStack_b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         vStack_b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&vStack_b0,(iterator)__first._M_current,
               (iterator)
               vStack_b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    WriteBuild(this,os,(cmNinjaBuild *)local_138,0,(bool *)0x0);
    local_338._24_8_ = &local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_338 + 0x18),"phony","");
    local_4c0._0_8_ = local_4c0 + 0x10;
    local_4c0._8_8_ = 0;
    local_4c0._16_8_ = local_4c0._16_8_ & 0xffffffffffffff00;
    local_4a0._M_p = (pointer)&local_490;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._24_8_ == &local_310) {
      local_490._8_8_ = local_310._8_8_;
    }
    else {
      local_4a0._M_p = (pointer)local_338._24_8_;
    }
    local_3f0._M_allocated_capacity = (size_type)&local_400;
    local_498._M_p = (pointer)local_338._32_8_;
    local_338._32_8_ = (pointer)0x0;
    local_310._M_local_buf[0] = '\0';
    local_400._M_p = local_400._M_p & 0xffffffff00000000;
    local_3f8 = (_Base_ptr)0x0;
    local_480._M_p = (pointer)0x0;
    pbStack_478 = (pointer)0x0;
    local_470._M_allocated_capacity = 0;
    local_470._8_8_ = 0;
    local_460._M_p = (pointer)0x0;
    pbStack_458 = (pointer)0x0;
    local_450._M_allocated_capacity = 0;
    local_450._8_8_ = 0;
    local_440._M_p = (pointer)0x0;
    pbStack_438 = (pointer)0x0;
    local_430._M_allocated_capacity = 0;
    local_430._8_8_ = 0;
    local_420._M_p = (pointer)0x0;
    pbStack_418 = (pointer)0x0;
    local_410._M_allocated_capacity = 0;
    local_3e0._M_p = (pointer)0x0;
    local_3d8._M_p = local_3d0 + 8;
    local_3d0._0_8_ = 0;
    local_3d0[8] = '\0';
    local_3f0._8_8_ = local_3f0._M_allocated_capacity;
    local_338._24_8_ = &local_310;
    std::__cxx11::string::_M_replace((ulong)local_4c0,0,(char *)0x0,0x4f439b);
    std::
    __set_difference<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (vStack_b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               vStack_b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    WriteBuild(this,os,(cmNinjaBuild *)local_4c0,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_4c0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_138);
    return;
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }
  cmLocalGenerator* lg = this->LocalGenerators[0];

  {
    cmNinjaRule rule("RERUN_CMAKE");
    rule.Command = CMakeCmd();
    rule.Command += " -S";
    rule.Command += lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                              cmOutputConverter::SHELL);
    rule.Command += " -B";
    rule.Command += lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                              cmOutputConverter::SHELL);
    rule.Description = "Re-running CMake...";
    rule.Comment = "Rule for re-running cmake.";
    rule.Generator = true;
    WriteRule(*this->RulesFileStream, rule);
  }

  cmNinjaBuild reBuild("RERUN_CMAKE");
  reBuild.Comment = "Re-run CMake if any of its inputs changed.";
  reBuild.Outputs.push_back(this->NinjaOutputPath(NINJA_BUILD_FILE));

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    for (std::string const& fi : localGen->GetMakefile()->GetListFiles()) {
      reBuild.ImplicitDeps.push_back(this->ConvertToNinjaPath(fi));
    }
  }
  reBuild.ImplicitDeps.push_back(this->CMakeCacheFile);

  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if (SupportsConsolePool()) {
    reBuild.Variables["pool"] = "console";
  }

  cmake* cm = this->GetCMakeInstance();
  if (this->SupportsManifestRestat() && cm->DoWriteGlobVerifyTarget()) {
    {
      cmNinjaRule rule("VERIFY_GLOBS");
      rule.Command = CMakeCmd();
      rule.Command += " -P ";
      rule.Command += lg->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                                cmOutputConverter::SHELL);
      rule.Description = "Re-checking globbed directories...";
      rule.Comment = "Rule for re-checking globbed directories.";
      rule.Generator = true;
      this->WriteRule(*this->RulesFileStream, rule);
    }

    cmNinjaBuild phonyBuild("phony");
    phonyBuild.Comment = "Phony target to force glob verification run.";
    phonyBuild.Outputs.push_back(cm->GetGlobVerifyScript() + "_force");
    this->WriteBuild(os, phonyBuild);

    reBuild.Variables["restat"] = "1";
    std::string const verifyScriptFile =
      this->NinjaOutputPath(cm->GetGlobVerifyScript());
    std::string const verifyStampFile =
      this->NinjaOutputPath(cm->GetGlobVerifyStamp());
    {
      cmNinjaBuild vgBuild("VERIFY_GLOBS");
      vgBuild.Comment =
        "Re-run CMake to check if globbed directories changed.";
      vgBuild.Outputs.push_back(verifyStampFile);
      vgBuild.ImplicitDeps = phonyBuild.Outputs;
      vgBuild.Variables = reBuild.Variables;
      this->WriteBuild(os, vgBuild);
    }
    reBuild.Variables.erase("restat");
    reBuild.ImplicitDeps.push_back(verifyScriptFile);
    reBuild.ExplicitDeps.push_back(verifyStampFile);
  } else if (!this->SupportsManifestRestat() &&
             cm->DoWriteGlobVerifyTarget()) {
    std::ostringstream msg;
    msg << "The detected version of Ninja:\n"
        << "  " << this->NinjaVersion << "\n"
        << "is less than the version of Ninja required by CMake for adding "
           "restat dependencies to the build.ninja manifest regeneration "
           "target:\n"
        << "  "
        << cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat()
        << "\n";
    msg << "Any pre-check scripts, such as those generated for file(GLOB "
           "CONFIGURE_DEPENDS), will not be run by Ninja.";
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           msg.str());
  }

  std::sort(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end());
  reBuild.ImplicitDeps.erase(
    std::unique(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end()),
    reBuild.ImplicitDeps.end());

  this->WriteBuild(os, reBuild);

  {
    cmNinjaBuild build("phony");
    build.Comment = "A missing CMake input file is not an error.";
    std::set_difference(std::make_move_iterator(reBuild.ImplicitDeps.begin()),
                        std::make_move_iterator(reBuild.ImplicitDeps.end()),
                        CustomCommandOutputs.begin(),
                        CustomCommandOutputs.end(),
                        std::back_inserter(build.Outputs));
    this->WriteBuild(os, build);
  }
}